

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

void duckdb_brotli::BrotliDecoderStateCleanup(BrotliDecoderStateInternal *s)

{
  long in_RDI;
  
  BrotliDecoderStateCleanupAfterMetablock((BrotliDecoderStateInternal *)0x2452d3e);
  (**(code **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x40),*(undefined8 *)(in_RDI + 0x328));
  *(undefined8 *)(in_RDI + 0x328) = 0;
  BrotliSharedDictionaryDestroyInstance((BrotliSharedDictionaryInternal *)s);
  *(undefined8 *)(in_RDI + 800) = 0;
  (**(code **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x40),*(undefined8 *)(in_RDI + 0x88));
  *(undefined8 *)(in_RDI + 0x88) = 0;
  (**(code **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x40),*(undefined8 *)(in_RDI + 0x100));
  *(undefined8 *)(in_RDI + 0x100) = 0;
  return;
}

Assistant:

void duckdb_brotli::BrotliDecoderStateCleanup(BrotliDecoderState* s) {
  BrotliDecoderStateCleanupAfterMetablock(s);

  BROTLI_DECODER_ON_FINISH(s);

  BROTLI_DECODER_FREE(s, s->compound_dictionary);
  BrotliSharedDictionaryDestroyInstance(s->dictionary);
  s->dictionary = NULL;
  BROTLI_DECODER_FREE(s, s->ringbuffer);
  BROTLI_DECODER_FREE(s, s->block_type_trees);
}